

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void pager_release_kv_engine(Pager *pPager)

{
  unqlite *pBackend;
  unqlite_kv_engine *pChunk;
  unqlite_kv_cursor *pChunk_00;
  _func_void_unqlite_kv_cursor_ptr *p_Var1;
  _func_void_unqlite_kv_engine_ptr *p_Var2;
  
  pBackend = pPager->pDb;
  pChunk = pPager->pEngine;
  pChunk_00 = (pBackend->sDB).pCursor;
  if (pChunk_00 != (unqlite_kv_cursor *)0x0) {
    p_Var1 = ((pBackend->sDB).pPager)->pEngine->pIo->pMethods->xCursorRelease;
    if (p_Var1 != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
      (*p_Var1)(pChunk_00);
    }
    SyMemBackendPoolFree(&pBackend->sMem,pChunk_00);
    (pBackend->sDB).pCursor = (unqlite_kv_cursor *)0x0;
  }
  p_Var2 = pChunk->pIo->pMethods->xRelease;
  if (p_Var2 != (_func_void_unqlite_kv_engine_ptr *)0x0) {
    (*p_Var2)(pChunk);
  }
  SyMemBackendFree(&pPager->pDb->sMem,pChunk->pIo);
  SyMemBackendFree(&pPager->pDb->sMem,pChunk);
  pPager->pEngine = (unqlite_kv_engine *)0x0;
  return;
}

Assistant:

static void pager_release_kv_engine(Pager *pPager)
{
	unqlite_kv_engine *pEngine = pPager->pEngine;
	unqlite_db *pStorage = &pPager->pDb->sDB;
	if( pStorage->pCursor ){
		/* Release the associated cursor */
		unqliteReleaseCursor(pPager->pDb,pStorage->pCursor);
		pStorage->pCursor = 0;
	}
	if( pEngine->pIo->pMethods->xRelease ){
		pEngine->pIo->pMethods->xRelease(pEngine);
	}
	/* Release the whole instance */
	SyMemBackendFree(&pPager->pDb->sMem,(void *)pEngine->pIo);
	SyMemBackendFree(&pPager->pDb->sMem,(void *)pEngine);
	pPager->pEngine = 0;
}